

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 reducerValue_local;
  U32 size_local;
  U32 *table_local;
  int local_30;
  U32 newVal;
  int column;
  U32 reducerThreshold;
  int rowNb;
  int cellNb;
  int nbRows;
  
  reducerThreshold = 0;
  if ((size & 0xf) != 0) {
    __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa03,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  if (size < 0x80000000) {
    for (column = 0; column < (int)size / 0x10; column = column + 1) {
      for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
        if (table[(int)reducerThreshold] < reducerValue + 2) {
          table_local._4_4_ = 0;
        }
        else {
          table_local._4_4_ = table[(int)reducerThreshold] - reducerValue;
        }
        table[(int)reducerThreshold] = table_local._4_4_;
        reducerThreshold = reducerThreshold + 1;
      }
    }
    return;
  }
  __assert_fail("size < (1U<<31)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xa04,"void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
               );
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}